

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O3

Vec_Ptr_t * gatherMonotoneSignals(Aig_Man_t *pAig)

{
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = pAig->vObjs;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar1->pArray[lVar2];
      if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
        Aig_ObjPrint(pAig,pObj);
        putchar(10);
        pVVar1 = pAig->vObjs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *gatherMonotoneSignals(Aig_Man_t *pAig)
{
    int i;
    Aig_Obj_t *pObj;

    Aig_ManForEachNode( pAig, pObj, i )
    {
        Aig_ObjPrint( pAig, pObj );
        printf("\n");
    }
    
    return NULL;
}